

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O0

int qpdfjob_write_qpdf(qpdfjob_handle j,qpdf_data qpdf)

{
  qpdf_data j_00;
  int iVar1;
  anon_class_8_1_8990bbdf local_40;
  function<int_(_qpdfjob_handle_*)> local_38;
  qpdf_data local_18;
  qpdf_data qpdf_local;
  qpdfjob_handle j_local;
  
  local_18 = qpdf;
  qpdf_local = (qpdf_data)j;
  QUtil::setLineBuf(_stdout);
  j_00 = qpdf_local;
  local_40.qpdf = local_18;
  std::function<int(_qpdfjob_handle*)>::function<qpdfjob_write_qpdf::__0,void>
            ((function<int(_qpdfjob_handle*)> *)&local_38,&local_40);
  iVar1 = wrap_qpdfjob((qpdfjob_handle)j_00,&local_38);
  std::function<int_(_qpdfjob_handle_*)>::~function(&local_38);
  return iVar1;
}

Assistant:

int
qpdfjob_write_qpdf(qpdfjob_handle j, qpdf_data qpdf)
{
    QUtil::setLineBuf(stdout);
    return wrap_qpdfjob(j, [qpdf](qpdfjob_handle jh) {
        jh->j.writeQPDF(*(qpdf->qpdf));
        return jh->j.getExitCode();
    });
}